

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::computeFrhs(SPxSolverBase<double> *this)

{
  uint uVar1;
  Representation RVar2;
  Status SVar3;
  Status *pSVar4;
  VectorBase<double> *pVVar5;
  pointer pdVar6;
  ulong uVar7;
  ostream *poVar8;
  SPxInternalCodeException *this_00;
  ulong uVar9;
  VectorBase<double> *pVVar10;
  int i;
  long lVar11;
  allocator local_49;
  string local_48;
  
  if (this->theRep == COLUMN) {
    VectorBase<double>::clear(this->theFrhs);
    if (this->theType != LEAVE) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
                (this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      return;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7a])(this);
    uVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
    pSVar4 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    RVar2 = this->theRep;
    pVVar5 = this->theFrhs;
    uVar9 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      SVar3 = pSVar4[uVar9];
      if (RVar2 * SVar3 < 1) {
        pVVar10 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right;
        switch(SVar3) {
        default:
          poVar8 = std::operator<<((ostream *)&std::cerr,"ESVECS01 ERROR: ");
          poVar8 = std::operator<<(poVar8,"inconsistent basis must not happen!");
          std::endl<char,std::char_traits<char>>(poVar8);
          this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_48,"XSVECS01 This should never happen.",&local_49);
          SPxInternalCodeException::SPxInternalCodeException(this_00,&local_48);
          __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_ON_LOWER:
          pVVar10 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left;
        case P_FIXED:
        case P_ON_UPPER:
          pdVar6 = (pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6[uVar9] =
               (pVVar10->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] + pdVar6[uVar9];
          break;
        case P_FREE:
          break;
        }
      }
    }
  }
  else {
    if (this->theType == ENTER) {
      VectorBase<double>::clear(this->theFrhs);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
                (this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      VectorBase<double>::operator+=
                (this->theFrhs,&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.object);
      return;
    }
    VectorBase<double>::operator=
              (this->theFrhs,&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.object);
    for (lVar11 = 0;
        lVar11 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                 set.thenum; lVar11 = lVar11 + 1) {
      SVar3 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11];
      if (this->theRep * SVar3 < 1) {
        switch(SVar3) {
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
          local_48._M_dataplus._M_p =
               (pointer)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11];
          if (((double)local_48._M_dataplus._M_p != 0.0) || (NAN((double)local_48._M_dataplus._M_p))
             ) {
            VectorBase<double>::multAdd<double,double>
                      (this->theFrhs,(double *)&local_48,
                       (SVectorBase<double> *)
                       ((this->thevectors->set).theitem + (this->thevectors->set).thekey[lVar11].idx
                       ));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs()
{

   if(rep() == COLUMN)
   {
      theFrhs->clear();

      if(type() == LEAVE)
      {
         computeFrhsXtra();

         for(int i = 0; i < this->nRows(); i++)
         {
            R x;

            typename SPxBasisBase<R>::Desc::Status stat = this->desc().rowStatus(i);

            if(!isBasic(stat))
            {
               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               // columnwise cases:
               case SPxBasisBase<R>::Desc::P_FREE :
                  continue;

               case(SPxBasisBase<R>::Desc::P_FIXED) :
                  assert(EQ(this->lhs(i), this->rhs(i), this->epsilon()));

               //lint -fallthrough
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  x = this->rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  x = this->lhs(i);
                  break;

               default:
                  SPX_MSG_ERROR(std::cerr << "ESVECS01 ERROR: "
                                << "inconsistent basis must not happen!"
                                << std::endl;)
                  throw SPxInternalCodeException("XSVECS01 This should never happen.");
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               (*theFrhs)[i] += x;     // slack !
            }
         }
      }
      else
      {
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
      }
   }
   else
   {
      assert(rep() == ROW);

      if(type() == ENTER)
      {
         theFrhs->clear();
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
         *theFrhs += this->maxObj();
      }
      else
      {
         ///@todo put this into a separate method
         *theFrhs = this->maxObj();
         const typename SPxBasisBase<R>::Desc& ds = this->desc();

         for(int i = 0; i < this->nRows(); ++i)
         {
            typename SPxBasisBase<R>::Desc::Status stat = ds.rowStatus(i);

            if(!isBasic(stat))
            {
               R x;

               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               case SPxBasisBase<R>::Desc::D_FREE :
                  continue;

               case SPxBasisBase<R>::Desc::D_ON_UPPER :
               case SPxBasisBase<R>::Desc::D_ON_LOWER :
               case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
                  x = this->maxRowObj(i);
                  break;

               default:
                  assert(this->lhs(i) <= R(-infinity) && this->rhs(i) >= R(infinity));
                  x = 0.0;
                  break;
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               // assert(x == 0.0);

               if(x != 0.0)
                  theFrhs->multAdd(x, vector(i));
            }
         }
      }
   }
}